

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void __thiscall ImFont::ImFont(ImFont *this)

{
  (this->IndexAdvanceX).Size = 0;
  (this->IndexAdvanceX).Capacity = 0;
  (this->IndexAdvanceX).Data = (float *)0x0;
  this->FallbackAdvanceX = 0.0;
  this->FontSize = 0.0;
  (this->IndexLookup).Size = 0;
  (this->IndexLookup).Capacity = 0;
  (this->IndexLookup).Data = (unsigned_short *)0x0;
  (this->Glyphs).Size = 0;
  (this->Glyphs).Capacity = 0;
  (this->Glyphs).Data = (ImFontGlyph *)0x0;
  this->EllipsisChar = 0xffff;
  this->DirtyLookupTables = false;
  this->FallbackGlyph = (ImFontGlyph *)0x0;
  (this->DisplayOffset).x = 0.0;
  (this->DisplayOffset).y = 0.0;
  this->ContainerAtlas = (ImFontAtlas *)0x0;
  this->ConfigData = (ImFontConfig *)0x0;
  this->ConfigDataCount = 0;
  this->FallbackChar = 0x3f;
  this->Descent = 0.0;
  this->MetricsTotalSurface = 0;
  this->Scale = 1.0;
  this->Ascent = 0.0;
  return;
}

Assistant:

inline ImVector()                                       { Size = Capacity = 0; Data = NULL; }